

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O1

double time_canonical<trng::mrg2,double>(mrg2 *r)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  string res;
  string local_48;
  double local_28;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  dVar8 = 0.0;
  lVar2 = 0x1000000;
  iVar5 = (r->S).r[0];
  iVar3 = (r->S).r[1];
  do {
    iVar4 = iVar5;
    uVar6 = (long)iVar3 * (long)(r->P).a[1] + (long)iVar4 * (long)(r->P).a[0];
    uVar7 = (uVar6 >> 0x1f) + (uVar6 & 0x7fffffff);
    uVar6 = uVar7 - 0xfffffffe;
    if (uVar7 < 0xfffffffe) {
      uVar6 = uVar7;
    }
    iVar5 = (int)uVar6 + -0x7fffffff;
    if (uVar6 < 0x7fffffff) {
      iVar5 = (int)uVar6;
    }
    dVar8 = dVar8 + (double)iVar5 * 4.656612873077393e-10 + 4.656612877414201e-10;
    lVar2 = lVar2 + -1;
    iVar3 = iVar4;
  } while (lVar2 != 0);
  (r->S).r[0] = iVar5;
  (r->S).r[1] = iVar4;
  lVar2 = std::chrono::_V2::system_clock::now();
  local_28 = 16.777216 / ((double)((lVar2 - lVar1) / 1000) * 1e-06);
  to_string<double>(&local_48,&local_28);
  while (local_48._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&local_48);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_48._M_dataplus._M_p,local_48._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return dVar8;
}

Assistant:

FLOAT time_canonical(R &r) {
  FLOAT s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += trng::generate_canonical<FLOAT>(r);
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}